

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles2::Functional::DepthStencilCase::iterate(DepthStencilCase *this)

{
  Surface *pSVar1;
  ReferenceQuadRenderer *pRVar2;
  RenderContext *context;
  bool bVar3;
  deUint32 dVar4;
  RenderTarget *pRVar5;
  long lVar6;
  uint viewportY;
  pointer pDVar7;
  IterateResult IVar8;
  uint uVar9;
  pointer pDVar10;
  char *pcVar11;
  RenderCommand *pRVar12;
  long lVar13;
  void *pvVar14;
  int iVar15;
  uint viewportX;
  pointer pRVar16;
  pointer pRVar17;
  int iVar18;
  byte bVar19;
  RGBA threshold;
  Surface renderedImg;
  Random rnd;
  RGBA local_344;
  Surface local_340;
  PixelBufferAccess local_328;
  PixelBufferAccess local_300;
  PixelBufferAccess local_2d8;
  PixelBufferAccess local_2b0;
  PixelBufferAccess local_288;
  PixelBufferAccess local_260;
  deRandom local_238;
  undefined1 local_228 [8];
  IVec2 IStack_220;
  undefined1 local_218 [104];
  ios_base local_1b0 [40];
  FragmentOperationState local_188;
  RenderCommand local_a4;
  
  bVar19 = 0;
  dVar4 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar9 = ((uint)this->m_iterNdx >> 0x10 ^ this->m_iterNdx ^ 0x3d) * 9;
  uVar9 = (uVar9 >> 4 ^ uVar9) * 0x27d4eb2d;
  deRandom_init(&local_238,uVar9 >> 0xf ^ dVar4 ^ uVar9);
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar18 = pRVar5->m_width;
  iVar15 = (this->m_renderTarget).width;
  dVar4 = deRandom_getUint32(&local_238);
  viewportX = dVar4 % ((iVar18 - iVar15) + 1U);
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar18 = pRVar5->m_height;
  iVar15 = (this->m_renderTarget).height;
  dVar4 = deRandom_getUint32(&local_238);
  viewportY = dVar4 % ((iVar18 - iVar15) + 1U);
  tcu::Surface::Surface(&local_340,(this->m_renderTarget).width,(this->m_renderTarget).height);
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar18 = (pRVar5->m_pixelFormat).alphaBits;
  uVar9 = 0;
  if (0 < iVar18) {
    uVar9 = 0x1000000 << (8U - (char)iVar18 & 0x1f);
  }
  local_344.m_value =
       0x100 << (8U - (char)(pRVar5->m_pixelFormat).greenBits & 0x1f) |
       1 << ((byte)(8 - (char)(pRVar5->m_pixelFormat).redBits) & 0x1f) |
       0x10000 << (8U - (char)(pRVar5->m_pixelFormat).blueBits & 0x1f) | uVar9;
  local_a4.color.m_data[0] = 1.0;
  local_a4.color.m_data[1] = 0.0;
  local_a4.color.m_data[2] = 0.0;
  local_a4.color.m_data[3] = 1.0;
  local_a4.colorMask.m_data[0] = true;
  local_a4.colorMask.m_data[1] = true;
  local_a4.colorMask.m_data[2] = true;
  local_a4.colorMask.m_data[3] = true;
  local_a4.rect.left = 0;
  local_a4.rect.bottom = 0;
  local_a4.rect.width = (this->m_renderTarget).width;
  local_a4.rect.height = (this->m_renderTarget).height;
  lVar13 = (long)this->m_iterNdx;
  pDVar7 = (this->m_cases).
           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar10 = pDVar7 + lVar13;
  pRVar12 = &local_a4;
  for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pRVar12->params).visibleFace = pDVar10->visibleFace;
    pDVar10 = (pointer)((long)pDVar10 + ((ulong)bVar19 * -2 + 1) * 4);
    pRVar12 = (RenderCommand *)((long)pRVar12 + ((ulong)bVar19 * -2 + 1) * 4);
  }
  local_a4.params.depthWriteMask = pDVar7[lVar13].depthWriteMask;
  if (lVar13 == 0) {
    local_228 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&IStack_220);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&IStack_220,
               "Channels:\n  RED: passing pixels\n  GREEN: stencil values\n  BLUE: depth values",
               0x4c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&IStack_220);
    std::ios_base::~ios_base(local_1b0);
    pDVar7 = (this->m_cases).
             super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if (1 < (ulong)(((long)(this->m_cases).
                         super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar7 >> 4) *
                 -0x3333333333333333)) {
    local_228 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&IStack_220);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&IStack_220,"Iteration ",10);
    std::ostream::operator<<((ostringstream *)&IStack_220,this->m_iterNdx);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&IStack_220,"...",3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&IStack_220);
    std::ios_base::~ios_base(local_1b0);
    pDVar7 = (this->m_cases).
             super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  DepthStencilCaseUtil::operator<<
            (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
             pDVar7 + this->m_iterNdx);
  DepthStencilCaseUtil::render(&this->m_baseClears,viewportX,viewportY);
  pRVar16 = (this->m_baseDepthRenders).
            super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar16 !=
      (this->m_baseDepthRenders).
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      DepthStencilCaseUtil::render(this->m_renderer,pRVar16,viewportX,viewportY);
      pRVar16 = pRVar16 + 1;
    } while (pRVar16 !=
             (this->m_baseDepthRenders).
             super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  DepthStencilCaseUtil::render(this->m_renderer,&local_a4,viewportX,viewportY);
  pRVar16 = (this->m_visualizeCommands).
            super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar16 !=
      (this->m_visualizeCommands).
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      DepthStencilCaseUtil::render(this->m_renderer,pRVar16,viewportX,viewportY);
      pRVar16 = pRVar16 + 1;
    } while (pRVar16 !=
             (this->m_visualizeCommands).
             super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  glwColorMask('\x01','\x01','\x01','\x01');
  glwDepthMask('\x01');
  glwStencilMask(0xffffffff);
  glwFlush();
  local_228._0_4_ = R;
  local_228._4_4_ = SNORM_INT8;
  IStack_220.m_data = (int  [2])&DAT_100000001;
  memset(local_218,0,0x90);
  rr::FragmentOperationState::FragmentOperationState(&local_188);
  DepthStencilCaseUtil::translateCommand
            (&local_a4,(RefRenderCommand *)local_228,&this->m_renderTarget);
  pSVar1 = this->m_refColorBuffer;
  local_2d8.super_ConstPixelBufferAccess.m_format.order = RGBA;
  local_2d8.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
  pvVar14 = (void *)(pSVar1->m_pixels).m_cap;
  if (pvVar14 != (void *)0x0) {
    pvVar14 = (pSVar1->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_328,(TextureFormat *)&local_2d8,pSVar1->m_width,pSVar1->m_height,1,pvVar14);
  tcu::TextureLevel::getAccess(&local_2d8,this->m_refStencilBuffer);
  DepthStencilCaseUtil::renderReference
            (&this->m_baseClears,&local_328,&local_2d8,(this->m_renderTarget).stencilBits);
  pRVar17 = (this->m_refBaseDepthRenders).
            super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar17 !=
      (this->m_refBaseDepthRenders).
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pRVar2 = this->m_refRenderer;
      pSVar1 = this->m_refColorBuffer;
      local_300.super_ConstPixelBufferAccess.m_format.order = RGBA;
      local_300.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
      pvVar14 = (void *)(pSVar1->m_pixels).m_cap;
      if (pvVar14 != (void *)0x0) {
        pvVar14 = (pSVar1->m_pixels).m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                (&local_2d8,(TextureFormat *)&local_300,pSVar1->m_width,pSVar1->m_height,1,pvVar14);
      deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_328,&local_2d8);
      tcu::TextureLevel::getAccess(&local_260,this->m_refDepthBuffer);
      deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_300,&local_260);
      tcu::TextureLevel::getAccess(&local_2b0,this->m_refStencilBuffer);
      deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_288,&local_2b0);
      deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
                (pRVar2,&local_328,&local_300,&local_288,&pRVar17->quad,&pRVar17->state);
      pRVar17 = pRVar17 + 1;
    } while (pRVar17 !=
             (this->m_refBaseDepthRenders).
             super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pRVar2 = this->m_refRenderer;
  pSVar1 = this->m_refColorBuffer;
  local_300.super_ConstPixelBufferAccess.m_format.order = RGBA;
  local_300.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
  pvVar14 = (void *)(pSVar1->m_pixels).m_cap;
  if (pvVar14 != (void *)0x0) {
    pvVar14 = (pSVar1->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_2d8,(TextureFormat *)&local_300,pSVar1->m_width,pSVar1->m_height,1,pvVar14);
  deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_328,&local_2d8);
  tcu::TextureLevel::getAccess(&local_260,this->m_refDepthBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_300,&local_260);
  tcu::TextureLevel::getAccess(&local_2b0,this->m_refStencilBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_288,&local_2b0);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
            (pRVar2,&local_328,&local_300,&local_288,(IntegerQuad *)local_228,&local_188);
  pRVar17 = (this->m_refVisualizeCommands).
            super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar17 !=
      (this->m_refVisualizeCommands).
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pRVar2 = this->m_refRenderer;
      pSVar1 = this->m_refColorBuffer;
      local_300.super_ConstPixelBufferAccess.m_format.order = RGBA;
      local_300.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
      pvVar14 = (void *)(pSVar1->m_pixels).m_cap;
      if (pvVar14 != (void *)0x0) {
        pvVar14 = (pSVar1->m_pixels).m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                (&local_2d8,(TextureFormat *)&local_300,pSVar1->m_width,pSVar1->m_height,1,pvVar14);
      deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_328,&local_2d8);
      tcu::TextureLevel::getAccess(&local_260,this->m_refDepthBuffer);
      deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_300,&local_260);
      tcu::TextureLevel::getAccess(&local_2b0,this->m_refStencilBuffer);
      deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_288,&local_2b0);
      deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
                (pRVar2,&local_328,&local_300,&local_288,&pRVar17->quad,&pRVar17->state);
      pRVar17 = pRVar17 + 1;
    } while (pRVar17 !=
             (this->m_refVisualizeCommands).
             super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_328.super_ConstPixelBufferAccess.m_format.order = RGBA;
  local_328.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
  if ((void *)local_340.m_pixels.m_cap != (void *)0x0) {
    local_340.m_pixels.m_cap = (size_t)local_340.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_228,(TextureFormat *)&local_328,local_340.m_width,
             local_340.m_height,1,(void *)local_340.m_pixels.m_cap);
  glu::readPixels(context,viewportX,viewportY,(PixelBufferAccess *)local_228);
  iVar18 = this->m_iterNdx + 1;
  this->m_iterNdx = iVar18;
  pDVar7 = (this->m_cases).
           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pDVar10 = (this->m_cases).
            super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar3 = tcu::pixelThresholdCompare
                    (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                     "CompareResult","Image Comparison Result",this->m_refColorBuffer,&local_340,
                     &local_344,COMPARE_LOG_RESULT);
  local_228 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&IStack_220);
  pcVar11 = "  FAILED!";
  if (bVar3) {
    pcVar11 = "  Passed.";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&IStack_220,pcVar11,9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&IStack_220);
  std::ios_base::~ios_base(local_1b0);
  if (bVar3) {
    iVar15 = (int)((ulong)((long)pDVar7 - (long)pDVar10) >> 4);
    IVar8 = CONTINUE;
    if (SBORROW4(iVar18,iVar15 * -0x33333333) != iVar18 + iVar15 * 0x33333333 < 0)
    goto LAB_00fdd232;
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  IVar8 = STOP;
LAB_00fdd232:
  tcu::Surface::~Surface(&local_340);
  return IVar8;
}

Assistant:

DepthStencilCase::IterateResult DepthStencilCase::iterate (void)
{
	de::Random				rnd				(deStringHash(getName()) ^ deInt32Hash(m_iterNdx));
	int						viewportX		= rnd.getInt(0, m_context.getRenderTarget().getWidth()-m_renderTarget.width);
	int						viewportY		= rnd.getInt(0, m_context.getRenderTarget().getHeight()-m_renderTarget.height);
	RenderCommand			testCmd;

	tcu::Surface			renderedImg		(m_renderTarget.width, m_renderTarget.height);
	tcu::RGBA				threshold		= m_context.getRenderTarget().getPixelFormat().getColorThreshold();

	// Fill in test command for this iteration.
	testCmd.color		= Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	testCmd.colorMask	= tcu::BVec4(true);
	testCmd.rect		= rr::WindowRectangle(0, 0, m_renderTarget.width, m_renderTarget.height);
	testCmd.params		= m_cases[m_iterNdx];

	if (m_iterNdx == 0)
	{
		m_testCtx.getLog() << TestLog::Message << "Channels:\n"
													"  RED: passing pixels\n"
													"  GREEN: stencil values\n"
													"  BLUE: depth values"
							<< TestLog::EndMessage;
	}

	if (m_cases.size() > 1)
		m_testCtx.getLog() << TestLog::Message << "Iteration " << m_iterNdx << "..." << TestLog::EndMessage;

	m_testCtx.getLog() << m_cases[m_iterNdx];

	// Submit render commands to gl GL.

	// Base clears.
	render(m_baseClears, viewportX, viewportY);

	// Base depths.
	for (vector<RenderCommand>::const_iterator cmd = m_baseDepthRenders.begin(); cmd != m_baseDepthRenders.end(); ++cmd)
		render(*m_renderer, *cmd, viewportX, viewportY);

	// Test command.
	render(*m_renderer, testCmd, viewportX, viewportY);

	// Visualization commands.
	for (vector<RenderCommand>::const_iterator cmd = m_visualizeCommands.begin(); cmd != m_visualizeCommands.end(); ++cmd)
		render(*m_renderer, *cmd, viewportX, viewportY);

	// Re-enable all write masks.
	glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
	glDepthMask(GL_TRUE);
	glStencilMask(~0u);

	// Ask GPU to start rendering.
	glFlush();

	// Render reference while GPU is doing work.
	{
		RefRenderCommand refTestCmd;
		translateCommand(testCmd, refTestCmd, m_renderTarget);

		// Base clears.
		renderReference(m_baseClears, m_refColorBuffer->getAccess(), m_refStencilBuffer->getAccess(), m_renderTarget.stencilBits);

		// Base depths.
		for (vector<RefRenderCommand>::const_iterator cmd = m_refBaseDepthRenders.begin(); cmd != m_refBaseDepthRenders.end(); ++cmd)
			m_refRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()),
								  gls::FragmentOpUtil::getMultisampleAccess(m_refDepthBuffer->getAccess()),
								  gls::FragmentOpUtil::getMultisampleAccess(m_refStencilBuffer->getAccess()),
								  cmd->quad, cmd->state);

		// Test command.
		m_refRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()),
							  gls::FragmentOpUtil::getMultisampleAccess(m_refDepthBuffer->getAccess()),
							  gls::FragmentOpUtil::getMultisampleAccess(m_refStencilBuffer->getAccess()),
							  refTestCmd.quad, refTestCmd.state);

		// Visualization commands.
		for (vector<RefRenderCommand>::const_iterator cmd = m_refVisualizeCommands.begin(); cmd != m_refVisualizeCommands.end(); ++cmd)
			m_refRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()),
								  gls::FragmentOpUtil::getMultisampleAccess(m_refDepthBuffer->getAccess()),
								  gls::FragmentOpUtil::getMultisampleAccess(m_refStencilBuffer->getAccess()),
								  cmd->quad, cmd->state);
	}

	// Read rendered image.
	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedImg.getAccess());

	m_iterNdx += 1;

	// Compare to reference.
	bool	isLastIter	= m_iterNdx >= (int)m_cases.size();
	bool	compareOk	= tcu::pixelThresholdCompare(m_testCtx.getLog(), "CompareResult", "Image Comparison Result", *m_refColorBuffer, renderedImg, threshold,
													 tcu::COMPARE_LOG_RESULT);

	m_testCtx.getLog() << TestLog::Message << (compareOk ? "  Passed." : "  FAILED!") << TestLog::EndMessage;
	if (!compareOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	if (compareOk && !isLastIter)
		return CONTINUE;
	else
		return STOP;
}